

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rational.cpp
# Opt level: O0

void anon_unknown.dwarf_6260c::test_numerator_construction<signed_char>(void)

{
  bool bVar1;
  ResultBuilder *pRVar2;
  ExpressionLhs<const_signed_char_&> EVar3;
  int local_5e0;
  value_type_conflict1 local_5d9;
  ExpressionLhs<const_signed_char_&> local_5d8;
  SourceLineInfo local_5c8;
  undefined1 local_5a0 [8];
  ResultBuilder __catchResult_1;
  ExpressionLhs<const_signed_char_&> local_2f8 [2];
  SourceLineInfo local_2d8;
  undefined1 local_2b0 [8];
  ResultBuilder __catchResult;
  rational r2;
  rational r1;
  
  __catchResult._670_2_ = 0x103;
  tcb::rational<signed_char>::rational<int,void>
            ((rational<signed_char> *)&__catchResult.field_0x29c,3);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_2d8,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x26);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_2b0,"REQUIRE",&local_2d8,"r2.num() == 3",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_2d8);
    __catchResult_1._671_1_ =
         tcb::rational<signed_char>::num((rational<signed_char> *)&__catchResult.field_0x29c);
    EVar3 = Catch::ResultBuilder::operator<=
                      ((ResultBuilder *)local_2b0,&__catchResult_1.field_0x29f);
    __catchResult_1.m_shouldDebugBreak = true;
    __catchResult_1.m_shouldThrow = false;
    __catchResult_1._666_2_ = 0;
    local_2f8[0] = EVar3;
    pRVar2 = Catch::ExpressionLhs<signed_char_const&>::operator==
                       ((ExpressionLhs<signed_char_const&> *)local_2f8,
                        (int *)&__catchResult_1.m_shouldDebugBreak);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_2b0);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_2b0);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_2b0);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  do {
    Catch::SourceLineInfo::SourceLineInfo
              (&local_5c8,
               "/workspace/llm4binary/github/license_c_cmakelists/tcbrindle[P]rational/test/test_rational.cpp"
               ,0x27);
    Catch::ResultBuilder::ResultBuilder
              ((ResultBuilder *)local_5a0,"REQUIRE",&local_5c8,"r2.denom() == 1",Normal,"");
    Catch::SourceLineInfo::~SourceLineInfo(&local_5c8);
    local_5d9 = tcb::rational<signed_char>::denom
                          ((rational<signed_char> *)&__catchResult.field_0x29c);
    EVar3 = Catch::ResultBuilder::operator<=((ResultBuilder *)local_5a0,&local_5d9);
    local_5e0 = 1;
    local_5d8 = EVar3;
    pRVar2 = Catch::ExpressionLhs<signed_char_const&>::operator==
                       ((ExpressionLhs<signed_char_const&> *)&local_5d8,&local_5e0);
    Catch::ResultBuilder::endExpression(pRVar2);
    bVar1 = Catch::ResultBuilder::shouldDebugBreak((ResultBuilder *)local_5a0);
    if (bVar1) {
      Catch::alwaysTrue();
    }
    Catch::ResultBuilder::react((ResultBuilder *)local_5a0);
    Catch::ResultBuilder::~ResultBuilder((ResultBuilder *)local_5a0);
    bVar1 = Catch::isTrue(false);
  } while (bVar1);
  return;
}

Assistant:

void test_numerator_construction()
{
    using rational = tcb::rational<T>;

    constexpr rational r1 = 3;
    static_assert(r1.num() == 3, "");
    static_assert(r1.denom() == 1, "");

    const rational r2 = 3;
    REQUIRE(r2.num() == 3);
    REQUIRE(r2.denom() == 1);
}